

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
 pybind11::detail::all_type_info_get_cache(PyTypeObject *type)

{
  internals *piVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar3;
  type local_80;
  handle local_78;
  PyObject *local_70;
  handle local_68;
  object local_60;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_58;
  undefined1 local_50;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> local_38;
  PyTypeObject *local_20;
  PyTypeObject *type_local;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  res;
  
  local_20 = type;
  piVar1 = get_internals();
  local_38.
  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::vector
            (&local_38);
  pVar3 = std::
          unordered_map<_typeobject*,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>,std::hash<_typeobject*>,std::equal_to<_typeobject*>,std::allocator<std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>>>
          ::
          emplace<_typeobject*&,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>
                    ((unordered_map<_typeobject*,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>,std::hash<_typeobject*>,std::equal_to<_typeobject*>,std::allocator<std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>>>
                      *)&piVar1->registered_types_py,&local_20,&local_38);
  local_58._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
       ._M_cur;
  local_50 = pVar3.second;
  type_local = (PyTypeObject *)local_58._M_cur;
  res.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur._0_1_ = local_50;
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
  ~vector(&local_38);
  uVar2 = extraout_RDX;
  if (((byte)res.first.
             super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             ._M_cur & 1) != 0) {
    handle::handle(&local_68,(PyObject *)local_20);
    local_80.type = local_20;
    cpp_function::
    cpp_function<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::handle)_1_,,void>
              ((cpp_function *)&local_78,&local_80);
    local_70 = local_78.m_ptr;
    weakref::weakref((weakref *)&local_60,local_68,local_78);
    object::release(&local_60);
    weakref::~weakref((weakref *)&local_60);
    cpp_function::~cpp_function((cpp_function *)&local_78);
    uVar2 = extraout_RDX_00;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = (bool)(byte)res.first.
                             super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                             ._M_cur;
  pVar3.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )type_local;
  return pVar3;
}

Assistant:

inline std::pair<decltype(internals::registered_types_py)::iterator, bool> all_type_info_get_cache(PyTypeObject *type) {
    auto res = get_internals().registered_types_py
#ifdef z__cpp_lib_unordered_map_try_emplace
        .try_emplace(type);
#else
        .emplace(type, std::vector<detail::type_info *>());
#endif
    if (res.second) {
        // New cache entry created; set up a weak reference to automatically remove it if the type
        // gets destroyed:
        weakref((PyObject *) type, cpp_function([type](handle wr) {
            get_internals().registered_types_py.erase(type);
            wr.dec_ref();
        })).release();
    }

    return res;
}